

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O1

void __thiscall iutest::TempFile::~TempFile(TempFile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  FILE *__stream;
  
  (this->super_IFile).super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__TempFile_0012e540;
  (this->super_IFile).super_IInStream._vptr_IInStream = (_func_int **)&PTR__TempFile_0012e590;
  Close(this);
  pcVar2 = (this->m_filename)._M_dataplus._M_p;
  paVar1 = &(this->m_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->m_file).super_IFile.super_IOutStream._vptr_IOutStream =
       (_func_int **)&PTR__StdioFile_0012e718;
  (this->m_file).super_IFile.super_IInStream._vptr_IInStream =
       (_func_int **)&PTR__StdioFile_0012e768;
  __stream = (FILE *)(this->m_file).m_fp;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    (this->m_file).m_fp = (FILE *)0x0;
  }
  return;
}

Assistant:

virtual ~TempFile() { Close(); }